

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_connection.c
# Opt level: O1

void amqp_release_buffers(amqp_connection_state_t state)

{
  long lVar1;
  amqp_pool_table_entry_t *paVar2;
  
  if (state->state == CONNECTION_STATE_IDLE) {
    lVar1 = 0;
    do {
      for (paVar2 = state->pool_table[lVar1]; paVar2 != (amqp_pool_table_entry_t *)0x0;
          paVar2 = paVar2->next) {
        amqp_maybe_release_buffers_on_channel(state,paVar2->channel);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    return;
  }
  amqp_abort("Programming error: invalid AMQP connection state: expected %d, got %d",0);
}

Assistant:

void amqp_release_buffers(amqp_connection_state_t state) {
  int i;
  ENFORCE_STATE(state, CONNECTION_STATE_IDLE);

  for (i = 0; i < POOL_TABLE_SIZE; ++i) {
    amqp_pool_table_entry_t *entry = state->pool_table[i];

    for (; NULL != entry; entry = entry->next) {
      amqp_maybe_release_buffers_on_channel(state, entry->channel);
    }
  }
}